

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O0

void loop_creating_worker(void *context)

{
  int iVar1;
  undefined1 local_b0 [4];
  int r;
  uv_signal_t signal;
  uv_loop_t *loop;
  void *context_local;
  
  while( true ) {
    signal._144_8_ = malloc(0x350);
    if ((void *)signal._144_8_ == (void *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
              ,0xad,"loop != NULL");
      abort();
    }
    iVar1 = uv_loop_init(signal._144_8_);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
              ,0xae,"0 == uv_loop_init(loop)");
      abort();
    }
    iVar1 = uv_signal_init(signal._144_8_,local_b0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
              ,0xb1,"r == 0");
      abort();
    }
    iVar1 = uv_signal_start(local_b0,signal_unexpected_cb,0xf);
    if (iVar1 != 0) break;
    uv_close(local_b0,0);
    iVar1 = uv_run(signal._144_8_,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
              ,0xb9,"r == 0");
      abort();
    }
    uv_loop_close(signal._144_8_);
    free((void *)signal._144_8_);
    increment_counter(&loop_creation_counter);
    if (stop != 0) {
      return;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
          ,0xb4,"r == 0");
  abort();
}

Assistant:

static void loop_creating_worker(void* context) {
  (void) context;

  do {
    uv_loop_t *loop;
    uv_signal_t signal;
    int r;

    loop = malloc(sizeof(*loop));
    ASSERT(loop != NULL);
    ASSERT(0 == uv_loop_init(loop));

    r = uv_signal_init(loop, &signal);
    ASSERT(r == 0);

    r = uv_signal_start(&signal, signal_unexpected_cb, SIGTERM);
    ASSERT(r == 0);

    uv_close((uv_handle_t*) &signal, NULL);

    r = uv_run(loop, UV_RUN_DEFAULT);
    ASSERT(r == 0);

    uv_loop_close(loop);
    free(loop);

    increment_counter(&loop_creation_counter);
  } while (!stop);
}